

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Matrix * rw::Matrix::invertGeneral(Matrix *dst,Matrix *src)

{
  float fVar1;
  float local_20;
  float32 invdet;
  float32 det;
  Matrix *src_local;
  Matrix *dst_local;
  
  (dst->right).x =
       (float32)((float)(src->up).y * (float)(src->at).z +
                -((float)(src->up).z * (float)(src->at).y));
  (dst->right).y =
       (float32)((float)(src->at).y * (float)(src->right).z +
                -((float)(src->at).z * (float)(src->right).y));
  (dst->right).z =
       (float32)((float)(src->right).y * (float)(src->up).z +
                -((float)(src->right).z * (float)(src->up).y));
  fVar1 = (float)(dst->right).x * (float)(src->right).x +
          (float)(src->up).x * (float)(dst->right).y + (float)(src->at).x * (float)(dst->right).z;
  local_20 = 1.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_20 = 1.0 / fVar1;
  }
  (dst->right).x = (float32)(local_20 * (float)(dst->right).x);
  (dst->right).y = (float32)(local_20 * (float)(dst->right).y);
  (dst->right).z = (float32)(local_20 * (float)(dst->right).z);
  (dst->up).x = (float32)(local_20 *
                         ((float)(src->up).z * (float)(src->at).x +
                         -((float)(src->up).x * (float)(src->at).z)));
  (dst->up).y = (float32)(local_20 *
                         ((float)(src->at).z * (float)(src->right).x +
                         -((float)(src->at).x * (float)(src->right).z)));
  (dst->up).z = (float32)(local_20 *
                         ((float)(src->right).z * (float)(src->up).x +
                         -((float)(src->right).x * (float)(src->up).z)));
  (dst->at).x = (float32)(local_20 *
                         ((float)(src->up).x * (float)(src->at).y +
                         -((float)(src->up).y * (float)(src->at).x)));
  (dst->at).y = (float32)(local_20 *
                         ((float)(src->at).x * (float)(src->right).y +
                         -((float)(src->at).y * (float)(src->right).x)));
  (dst->at).z = (float32)(local_20 *
                         ((float)(src->right).x * (float)(src->up).y +
                         -((float)(src->right).y * (float)(src->up).x)));
  (dst->pos).x = (float32)-((float)(src->pos).z * (float)(dst->at).x +
                           (float)(src->pos).x * (float)(dst->right).x +
                           (float)(src->pos).y * (float)(dst->up).x);
  (dst->pos).y = (float32)-((float)(src->pos).z * (float)(dst->at).y +
                           (float)(src->pos).x * (float)(dst->right).y +
                           (float)(src->pos).y * (float)(dst->up).y);
  (dst->pos).z = (float32)-((float)(src->pos).z * (float)(dst->at).z +
                           (float)(src->pos).x * (float)(dst->right).z +
                           (float)(src->pos).y * (float)(dst->up).z);
  dst->flags = dst->flags & 0xfffdffff;
  return dst;
}

Assistant:

Matrix*
Matrix::invertGeneral(Matrix *dst, const Matrix *src)
{
	float32 det, invdet;
	// calculate a few cofactors
	dst->right.x = src->up.y*src->at.z - src->up.z*src->at.y;
	dst->right.y = src->at.y*src->right.z - src->at.z*src->right.y;
	dst->right.z = src->right.y*src->up.z - src->right.z*src->up.y;
	// get the determinant from that
	det = src->up.x * dst->right.y + src->at.x * dst->right.z + dst->right.x * src->right.x;
	invdet = 1.0;
	if(det != 0.0f)
		invdet = 1.0f/det;
	dst->right.x *= invdet;
	dst->right.y *= invdet;
	dst->right.z *= invdet;
	dst->up.x = invdet * (src->up.z*src->at.x - src->up.x*src->at.z);
	dst->up.y = invdet * (src->at.z*src->right.x - src->at.x*src->right.z);
	dst->up.z = invdet * (src->right.z*src->up.x - src->right.x*src->up.z);
	dst->at.x = invdet * (src->up.x*src->at.y - src->up.y*src->at.x);
	dst->at.y = invdet * (src->at.x*src->right.y - src->at.y*src->right.x);
	dst->at.z = invdet * (src->right.x*src->up.y - src->right.y*src->up.x);
	dst->pos.x = -(src->pos.x*dst->right.x + src->pos.y*dst->up.x + src->pos.z*dst->at.x);
	dst->pos.y = -(src->pos.x*dst->right.y + src->pos.y*dst->up.y + src->pos.z*dst->at.y);
	dst->pos.z = -(src->pos.x*dst->right.z + src->pos.y*dst->up.z + src->pos.z*dst->at.z);
	dst->flags &= ~IDENTITY;
	return dst;
}